

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericitemmodel.cpp
# Opt level: O2

int __thiscall QGenericItemModel::rowCount(QGenericItemModel *this,QModelIndex *parent)

{
  int iVar1;
  
  iVar1 = QGenericItemModelImplBase::callConst<int,QModelIndex>
                    (*(QGenericItemModelImplBase **)(this + 0x10),RowCount,parent);
  return iVar1;
}

Assistant:

int QGenericItemModel::rowCount(const QModelIndex &parent) const
{
    return impl->callConst<int>(QGenericItemModelImplBase::RowCount, parent);
}